

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Relay.cpp
# Opt level: O1

void __thiscall
RenX_RelayPlugin::process_renx_message
          (RenX_RelayPlugin *this,Server *server,upstream_server_info *server_info,string_view line,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens)

{
  Server *pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  size_t __n;
  string_view sVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  result_type rVar8;
  result_type rVar9;
  result_type rVar10;
  pointer pbVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar13;
  Server *pSVar14;
  pointer pcVar15;
  Server *pSVar16;
  size_type __rlen;
  size_type sVar17;
  _Elt_pointer this_00;
  undefined8 uVar18;
  long lVar19;
  upstream_settings *puVar20;
  long lVar21;
  char *pcVar22;
  string_view in_message;
  string_view in_message_00;
  string_view sVar23;
  uniform_int_distribution<unsigned_int> dist;
  container_type player_tokens;
  uniform_int_distribution<unsigned_long> dist_1;
  string line_sanitized;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a88;
  ulong local_a68;
  ulong local_a58;
  upstream_settings *local_a48;
  result_type local_a3c;
  long *local_a38 [2];
  long local_a28 [2];
  char *local_a18;
  size_t local_a10;
  uniform_int_distribution<unsigned_long> local_a08;
  undefined1 local_9f8 [2496];
  size_t local_38;
  
  if ((((server_info->m_socket)._M_t.
        super___uniq_ptr_impl<Jupiter::TCPSocket,_std::default_delete<Jupiter::TCPSocket>_>._M_t.
        super__Tuple_impl<0UL,_Jupiter::TCPSocket_*,_std::default_delete<Jupiter::TCPSocket>_>.
        super__Head_base<0UL,_Jupiter::TCPSocket_*,_false>._M_head_impl != (TCPSocket *)0x0) &&
      ((local_a48 = server_info->m_settings, local_a48->m_suppress_chat_logs != true ||
       (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare((tokens->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start,"lCHAT"), iVar7 != 0)))) &&
     ((pbVar11 = (tokens->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start, pbVar11->_M_string_length == 0 ||
      (((cVar3 = *(pbVar11->_M_dataplus)._M_p, cVar3 != 'r' && (cVar3 != 'c')) ||
       (server_info->m_processing_command == true)))))) {
    local_a18 = line._M_str;
    local_a10 = line._M_len;
    if ((local_a48->m_sanitize_names == true) &&
       (pbVar11 = (tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
       (tokens->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish != pbVar11)) {
      lVar21 = 0;
      bVar6 = false;
      lVar19 = 0;
      do {
        pcVar22 = *(char **)((long)&(pbVar11->_M_dataplus)._M_p + lVar21);
        bVar5 = is_player_token(pcVar22,pcVar22 + *(long *)((long)&pbVar11->_M_string_length +
                                                           lVar21));
        if (bVar5) {
          pbVar13 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&(pbVar11->_M_dataplus)._M_p + lVar21);
          begin._M_current = (pbVar13->_M_dataplus)._M_p;
          jessilib::
          split_n<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                    ((container_type *)&local_a88,begin,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(begin._M_current + pbVar13->_M_string_length),',',2);
          sVar17 = *(size_type *)(local_a88._M_dataplus._M_p + 0x10);
          pcVar22 = *(char **)(local_a88._M_dataplus._M_p + 0x18);
          local_9f8._0_8_ = local_9f8 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_9f8,*(long *)(local_a88._M_dataplus._M_p + 8),
                     *(long *)(local_a88._M_dataplus._M_p + 8) +
                     *(size_type *)local_a88._M_dataplus._M_p);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     ',');
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     pcVar22,sVar17);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     ',');
          if ((sVar17 != 0) && (*pcVar22 == 'b')) {
            pcVar22 = pcVar22 + 1;
            sVar17 = sVar17 - 1;
          }
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     "Player");
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     pcVar22,sVar17);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                    (pbVar13,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_9f8);
          if ((undefined1 *)local_9f8._0_8_ != local_9f8 + 0x10) {
            operator_delete((void *)local_9f8._0_8_,CONCAT71(local_9f8._17_7_,local_9f8[0x10]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a88._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_a88._M_dataplus._M_p,
                            local_a88.field_2._M_allocated_capacity -
                            (long)local_a88._M_dataplus._M_p);
          }
          bVar6 = true;
        }
        lVar19 = lVar19 + 1;
        pbVar11 = (tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        lVar21 = lVar21 + 0x20;
      } while (lVar19 != (long)(tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5);
    }
    else {
      bVar6 = false;
    }
    if (((local_a48->m_sanitize_ips != false) || (local_a48->m_sanitize_hwids == true)) &&
       (pbVar11 = (tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,
       (tokens->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish != pbVar11)) {
      pSVar1 = server + 0x10;
      lVar19 = 0;
      puVar20 = local_a48;
      do {
        pbVar13 = pbVar11 + lVar19;
        if (puVar20->m_sanitize_ips == true) {
          local_a38[0] = local_a28;
          pcVar15 = (pbVar13->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_a38,pcVar15,pcVar15 + pbVar13->_M_string_length);
          iVar7 = Jupiter::Socket::pton4((char *)local_a38[0]);
          pSVar14 = pSVar1;
          if (iVar7 == 0) {
LAB_0012684e:
            pSVar16 = (Server *)0x0;
          }
          else {
            do {
              pSVar14 = *(Server **)pSVar14;
              if (pSVar14 == pSVar1) goto LAB_0012684e;
              pSVar16 = pSVar14 + 0x10;
            } while (*(int *)(pSVar14 + 0x100) != iVar7);
          }
          if (local_a38[0] != local_a28) {
            operator_delete(local_a38[0],local_a28[0] + 1);
          }
          if (pSVar16 == (Server *)0x0) goto LAB_0012687e;
          local_9f8._0_8_ = (long)*(int *)(pSVar16 + 0xfc) * 2 + (this->m_init_time).__d.__r;
          lVar21 = 1;
          pcVar15 = (pointer)local_9f8._0_8_;
          do {
            pcVar15 = (pointer)(((ulong)pcVar15 >> 0x3e ^ (ulong)pcVar15) * 0x5851f42d4c957f2d +
                               lVar21);
            *(pointer *)(local_9f8 + lVar21 * 8) = pcVar15;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x138);
          local_38 = 0x138;
          local_aa8._M_dataplus._M_p = (char *)0xc80000000a;
          rVar8 = std::uniform_int_distribution<unsigned_int>::operator()
                            ((uniform_int_distribution<unsigned_int> *)&local_aa8,
                             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                              *)local_9f8,(param_type *)&local_aa8);
          local_a3c = std::uniform_int_distribution<unsigned_int>::operator()
                                ((uniform_int_distribution<unsigned_int> *)&local_aa8,
                                 (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                  *)local_9f8,(param_type *)&local_aa8);
          rVar9 = std::uniform_int_distribution<unsigned_int>::operator()
                            ((uniform_int_distribution<unsigned_int> *)&local_aa8,
                             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                              *)local_9f8,(param_type *)&local_aa8);
          rVar10 = std::uniform_int_distribution<unsigned_int>::operator()
                             ((uniform_int_distribution<unsigned_int> *)&local_aa8,
                              (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                               *)local_9f8,(param_type *)&local_aa8);
          local_a88._M_dataplus._M_p = (pointer)(ulong)rVar8;
          local_a88.field_2._M_allocated_capacity = (size_type)local_a3c;
          local_a68 = (ulong)rVar9;
          local_a58 = (ulong)rVar10;
          fmt::v8::vformat_abi_cxx11_(&local_ac8,"{}.{}.{}.{}",0xb,0x2222,&local_a88);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (pbVar13,&local_ac8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
            operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
          }
          bVar6 = true;
        }
        else {
LAB_0012687e:
          if (puVar20->m_sanitize_hwids == true) {
            __n = pbVar13->_M_string_length;
            if (__n == 0) {
LAB_001268dc:
              pSVar16 = (Server *)0x0;
            }
            else {
              pcVar15 = (pbVar13->_M_dataplus)._M_p;
              pSVar14 = pSVar1;
              do {
                pSVar14 = *(Server **)pSVar14;
                if (pSVar14 == pSVar1) goto LAB_001268dc;
                if (*(size_t *)(pSVar14 + 0xe0) == __n) {
                  iVar7 = bcmp(pcVar15,*(void **)(pSVar14 + 0xd8),__n);
                  bVar5 = iVar7 == 0;
                }
                else {
                  bVar5 = false;
                }
                pSVar16 = pSVar14 + 0x10;
              } while (!bVar5);
            }
            puVar20 = local_a48;
            if (pSVar16 != (Server *)0x0) {
              local_9f8._0_8_ =
                   (this->m_init_time).__d.__r + (long)*(int *)(pSVar16 + 0xfc) * 2 + 0x45;
              lVar21 = 1;
              pcVar15 = (pointer)local_9f8._0_8_;
              do {
                pcVar15 = (pointer)(((ulong)pcVar15 >> 0x3e ^ (ulong)pcVar15) * 0x5851f42d4c957f2d +
                                   lVar21);
                *(pointer *)(local_9f8 + lVar21 * 8) = pcVar15;
                lVar21 = lVar21 + 1;
              } while (lVar21 != 0x138);
              local_38 = 0x138;
              local_a08._M_param._M_a = 0;
              local_a08._M_param._M_b = 0xffffffffffff;
              std::uniform_int_distribution<unsigned_long>::operator()
                        (&local_a08,
                         (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                          *)local_9f8,&local_a08._M_param);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_replace(pbVar13,0,pbVar13->_M_string_length,"m",1);
              to_hex<unsigned_int>(0);
              to_hex<unsigned_int>(0);
              uVar18 = (char *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
                uVar18 = local_ac8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar18 < (char *)(local_aa8._M_string_length + local_ac8._M_string_length))
              {
                uVar18 = (char *)0xf;
                if (local_aa8._M_dataplus._M_p != (pointer)((long)&local_aa8 + 0x10)) {
                  uVar18 = local_aa8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar18 <
                    (char *)(local_aa8._M_string_length + local_ac8._M_string_length))
                goto LAB_00126a19;
                pbVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                    (&local_aa8,0,0,local_ac8._M_dataplus._M_p,
                                     local_ac8._M_string_length);
              }
              else {
LAB_00126a19:
                pbVar12 = std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          _M_append(&local_ac8,local_aa8._M_dataplus._M_p,local_aa8._M_string_length
                                   );
              }
              local_a88._M_dataplus._M_p = (pbVar12->_M_dataplus)._M_p;
              paVar2 = &pbVar12->field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a88._M_dataplus._M_p == paVar2) {
                local_a88.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
                local_a88.field_2._8_8_ = *(undefined8 *)((long)&pbVar12->field_2 + 8);
                local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
              }
              else {
                local_a88.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
              }
              local_a88._M_string_length = pbVar12->_M_string_length;
              (pbVar12->_M_dataplus)._M_p = (pointer)paVar2;
              pbVar12->_M_string_length = 0;
              paVar2->_M_local_buf[0] = '\0';
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_append(pbVar13,local_a88._M_dataplus._M_p,local_a88._M_string_length);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
                operator_delete(local_a88._M_dataplus._M_p,
                                local_a88.field_2._M_allocated_capacity + 1);
              }
              if (local_aa8._M_dataplus._M_p != (pointer)((long)&local_aa8 + 0x10)) {
                operator_delete(local_aa8._M_dataplus._M_p,
                                local_aa8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
                operator_delete(local_ac8._M_dataplus._M_p,
                                local_ac8.field_2._M_allocated_capacity + 1);
              }
              bVar6 = true;
              goto LAB_00126ceb;
            }
          }
          if (puVar20->m_sanitize_steam_ids == true) {
            pcVar22 = (pbVar13->_M_dataplus)._M_p;
            local_9f8._0_8_ = (pointer)0x0;
            std::from_chars<unsigned_long>
                      (pcVar22,pcVar22 + pbVar13->_M_string_length,(unsigned_long *)local_9f8,10);
            pSVar14 = pSVar1;
            if ((pointer)local_9f8._0_8_ != (pointer)0x0) {
              do {
                pSVar14 = *(Server **)pSVar14;
                if (pSVar14 == pSVar1) {
                  pSVar16 = (Server *)0x0;
                  break;
                }
                pSVar16 = pSVar14 + 0x10;
              } while (*(pointer *)(pSVar14 + 0xf8) != (pointer)local_9f8._0_8_);
              if (pSVar16 != (Server *)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                _M_replace(pbVar13,0,pbVar13->_M_string_length,"0x0000000000000000",0x12);
              }
            }
          }
        }
LAB_00126ceb:
        lVar19 = lVar19 + 1;
        pbVar11 = (tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      } while (lVar19 != (long)(tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5);
    }
    pcVar22 = local_9f8 + 0x10;
    local_9f8._8_8_ = 0;
    local_9f8[0x10] = '\0';
    local_9f8._0_8_ = pcVar22;
    if (bVar6) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                 (tokens->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start);
      cVar3 = (char)RenX::DelimC;
      if ((long)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start != 0x20) {
        lVar21 = 1;
        lVar19 = 0x28;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     cVar3);
          pbVar11 = (tokens->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,
                     *(char **)((long)pbVar11 + lVar19 + -8),
                     *(size_type *)((long)&(pbVar11->_M_dataplus)._M_p + lVar19));
          lVar21 = lVar21 + 1;
          lVar19 = lVar19 + 0x20;
        } while (lVar21 != (long)(tokens->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(tokens->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 5);
      }
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,0,0,
                 local_a18,local_a10);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9f8,'\n');
    in_message._M_str = (char *)local_9f8._0_8_;
    in_message._M_len = local_9f8._8_8_;
    send_upstream(this,server_info,in_message,server);
    sVar4._M_str = (char *)local_aa8._M_string_length;
    sVar4._M_len = (size_t)local_aa8._M_dataplus._M_p;
    if ((*(char *)local_9f8._0_8_ == 'c') &&
       (local_aa8._0_16_ = sVar4, server_info->m_processing_command == true)) {
      server_info->m_processing_command = false;
      if ((server_info->m_response_queue).
          super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (server_info->m_response_queue).
          super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"COMMAND FINISHED PROCESSING ON EMPTY QUEUE",0x2a);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x18);
        std::ostream::put(-0x18);
        std::ostream::flush();
      }
      else {
        if (*(this->m_command_tracker).
             super__Deque_base<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur != server_info) {
          __assert_fail("m_command_tracker.front() == &server_info",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Plugins/RenX/RenX.Relay/RenX_Relay.cpp"
                        ,0x21f,
                        "void RenX_RelayPlugin::process_renx_message(RenX::Server &, upstream_server_info &, std::string_view, std::vector<std::string>)"
                       );
        }
        std::
        deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
        ::pop_front(&server_info->m_response_queue);
        std::
        deque<RenX_RelayPlugin::upstream_server_info_*,_std::allocator<RenX_RelayPlugin::upstream_server_info_*>_>
        ::pop_front(&this->m_command_tracker);
        paVar2 = &local_a88.field_2;
        local_a88._M_string_length = 0;
        local_a88.field_2._M_allocated_capacity =
             local_a88.field_2._M_allocated_capacity & 0xffffffffffffff00;
        this_00 = (server_info->m_response_queue).
                  super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_a88._M_dataplus._M_p = (pointer)paVar2;
        if ((server_info->m_response_queue).
            super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur != this_00) {
          do {
            if (this_00->m_is_fake != true) break;
            sVar17 = (server_info->m_settings->m_rcon_username)._M_string_length;
            if (sVar17 == 0) {
              sVar23 = (string_view)RenX::Server::getRCONUsername();
            }
            else {
              sVar23._M_str = (server_info->m_settings->m_rcon_username)._M_dataplus._M_p;
              sVar23._M_len = sVar17;
            }
            local_aa8._0_16_ = sVar23;
            UpstreamCommand::to_rcon_abi_cxx11_(&local_ac8,this_00,(string_view *)&local_aa8);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&local_a88,&local_ac8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
              operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1
                             );
            }
            in_message_00._M_str = local_a88._M_dataplus._M_p;
            in_message_00._M_len = local_a88._M_string_length;
            send_upstream(this,server_info,in_message_00,server);
            std::
            deque<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
            ::pop_front(&server_info->m_response_queue);
            this_00 = (server_info->m_response_queue).
                      super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
          } while ((server_info->m_response_queue).
                   super__Deque_base<RenX_RelayPlugin::UpstreamCommand,_std::allocator<RenX_RelayPlugin::UpstreamCommand>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur != this_00);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a88._M_dataplus._M_p != paVar2) {
          operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((char *)local_9f8._0_8_ != pcVar22) {
      operator_delete((void *)local_9f8._0_8_,CONCAT71(local_9f8._17_7_,local_9f8[0x10]) + 1);
    }
  }
  return;
}

Assistant:

void RenX_RelayPlugin::process_renx_message(RenX::Server& server, upstream_server_info& server_info, std::string_view line, std::vector<std::string> tokens) {
	bool required_sanitization = false;
	if (!server_info.m_socket) {
		// early out: no upstream RCON session
		return;
	}

	const upstream_settings& settings = *server_info.m_settings;
	if (settings.m_suppress_chat_logs
		&& tokens[0] == "lCHAT") {
		return;
	}

	// Suppress unassociated command responses from going upstream
	if (!tokens[0].empty()
		&& (tokens[0][0] == 'r' || tokens[0][0] == 'c')
		&& !server_info.m_processing_command) {
		// This command response wasn't requested upstream; suppress it
		return;
	}

	auto findPlayerByIP = [&server](std::string in_ip) -> const RenX::PlayerInfo* {
		// Parse into integer so we're doing int comparisons instead of strings
		auto ip32 = Jupiter::Socket::pton4(in_ip.c_str());
		if (ip32 == 0) {
			return nullptr;
		}

		// Search players
		for (const auto& player : server.players) {
			if (player.ip32 == ip32) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerByHWID = [&server](std::string_view in_hwid) -> const RenX::PlayerInfo* {
		if (in_hwid.empty()) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.hwid == in_hwid) {
				return &player;
			}
		}

		return nullptr;
	};

	auto findPlayerBySteamID = [&server](std::string_view in_steamid) -> const RenX::PlayerInfo* {
		uint64_t steamid{};
		std::from_chars(in_steamid.data(), in_steamid.data() + in_steamid.size(), steamid);
		if (steamid == 0) {
			return nullptr;
		}

		for (const auto& player : server.players) {
			if (player.steamid == steamid) {
				return &player;
			}
		}

		return nullptr;
	};

	if (settings.m_sanitize_names) {
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			if (is_player_token(token.data(), token.data() + token.size())) {
				// Get token pieces
				auto player_tokens = jessilib::split_n_view(token, ',', 2);
				std::string_view idToken = player_tokens[1];

				std::string replacement_player = static_cast<std::string>(player_tokens[0]);
				replacement_player += ',';
				replacement_player += idToken;
				replacement_player += ',';
				if (!idToken.empty() && idToken.front() == 'b') {
					idToken.remove_prefix(1);
				}

				// Name (sanitized)
				replacement_player += "Player";
				replacement_player += idToken;

				token = replacement_player;
				required_sanitization = true;
			}
		}
	}

	if (settings.m_sanitize_ips || settings.m_sanitize_hwids) {
		// It's way too much of a pain to check for command usages, and it's not full-proof either (an alias or similar could be added).
		// So instead, we'll just search all messages for any tokens containing any player's IP or HWID.
		// This isn't terribly efficient, but there's only up to 64 players, so not a huge concern
		for (size_t index = 0; index != tokens.size(); ++index) {
			auto& token = tokens[index];
			const RenX::PlayerInfo* player;
			if (settings.m_sanitize_ips) {
				player = findPlayerByIP(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake IPs will be consistent
					// Also include player ID so we get different IPs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2));
					std::uniform_int_distribution<uint32_t> dist(10, 200);

					// Replace real IP with fake
					//token.format("%u.%u.%u.%u",
					token = fmt::format("{}.{}.{}.{}",
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)),
						static_cast<unsigned int>(dist(randgen)));

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_hwids) {
				player = findPlayerByHWID(token);
				if (player != nullptr) {
					// Initialize the engine here using the init time, so that player fake HWIDs will be consistent
					// Also include player ID so we get different HWIDs between players and for each match
					std::mt19937_64 randgen(m_init_time.time_since_epoch().count() + (player->id * 2 + 69));
					std::uniform_int_distribution<uint64_t> dist(0, 0x0000FFFFFFFFFFFFULL);

					HWID hwid{};
					hwid.hwid = dist(randgen);

					token = "m";
					token += to_hex(hwid.left) + to_hex(hwid.right);

					required_sanitization = true;
					continue;
				}
			}

			if (settings.m_sanitize_steam_ids) {
				player = findPlayerBySteamID(token);
				if (player != nullptr) {
					token = g_blank_steamid;
					continue;
				}
			}

			// More sanitization checks here...
		}
	}

	std::string line_sanitized;
	if (required_sanitization) {
		// Construct line to send and send it
		line_sanitized = tokens[0];
		for (size_t index = 1; index != tokens.size(); ++index) {
			line_sanitized += RenX::DelimC;
			line_sanitized += tokens[index];
		}
	}
	else {
		// Forward line without modification
		line_sanitized = line;
	}

	line_sanitized += '\n';
	send_upstream(server_info, line_sanitized, server);

	if (line_sanitized[0] == 'c'
		&& server_info.m_processing_command) {
		auto& queue = server_info.m_response_queue;
		server_info.m_processing_command = false;

		if (queue.empty()) {
			std::cerr << "COMMAND FINISHED PROCESSING ON EMPTY QUEUE" << std::endl;
			return;
		}

		assert(m_command_tracker.front() == &server_info);

		// We've finished executing a real command; pop it and go through any pending fakes
		queue.pop_front();
		m_command_tracker.pop_front();

		std::string response;
		while (!queue.empty() && queue.front().m_is_fake) {
			response = queue.front().to_rcon(get_upstream_rcon_username(server_info, server));
			send_upstream(server_info, response, server);
			queue.pop_front();
		}
	}
}